

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O2

void __thiscall
QTreeWidgetPrivate::selectionChanged
          (QTreeWidgetPrivate *this,QItemSelection *selected,QItemSelection *deselected)

{
  undefined1 *puVar1;
  QTreeWidget *this_00;
  QTreeWidgetItem *pQVar2;
  QTreeModel *this_01;
  QModelIndex *pQVar3;
  long lVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<QModelIndex> local_48;
  Data *local_28;
  
  local_28 = *(Data **)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeWidget **)
             &(this->super_QTreeViewPrivate).super_QAbstractItemViewPrivate.
              super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  QItemSelection::indexes();
  treeModel(this);
  lVar4 = 0;
  for (pQVar3 = (QModelIndex *)0x0; pQVar3 < (ulong)local_48.size;
      pQVar3 = (QModelIndex *)((long)&pQVar3->r + 1)) {
    pQVar2 = QTreeModel::item((QTreeModel *)this,
                              (QModelIndex *)
                              ((long)&(((QArrayData *)&(local_48.ptr)->r)->ref_)._q_value.
                                      super___atomic_base<int>._M_i + lVar4));
    puVar1 = &pQVar2->d->field_0x20;
    *puVar1 = *puVar1 | 2;
    lVar4 = lVar4 + 0x18;
  }
  this_01 = (QTreeModel *)&stack0xffffffffffffffa0;
  QItemSelection::indexes();
  QArrayDataPointer<QModelIndex>::operator=(&local_48,(QArrayDataPointer<QModelIndex> *)this_01);
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer((QArrayDataPointer<QModelIndex> *)this_01);
  lVar4 = 0;
  for (pQVar3 = (QModelIndex *)0x0; pQVar3 < (ulong)local_48.size;
      pQVar3 = (QModelIndex *)((long)&pQVar3->r + 1)) {
    pQVar2 = QTreeModel::item(this_01,(QModelIndex *)
                                      ((long)&(((QArrayData *)&(local_48.ptr)->r)->ref_)._q_value.
                                              super___atomic_base<int>._M_i + lVar4));
    puVar1 = &pQVar2->d->field_0x20;
    *puVar1 = *puVar1 & 0xfd;
    lVar4 = lVar4 + 0x18;
  }
  QTreeWidget::itemSelectionChanged(this_00);
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_48);
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeWidgetPrivate::selectionChanged(const QItemSelection &selected, const QItemSelection &deselected)
{
    Q_Q(QTreeWidget);
    QModelIndexList indices = selected.indexes();
    int i;
    QTreeModel *m = treeModel();
    for (i = 0; i < indices.size(); ++i) {
        QTreeWidgetItem *item = m->item(indices.at(i));
        item->d->selected = true;
    }

    indices = deselected.indexes();
    for (i = 0; i < indices.size(); ++i) {
        QTreeWidgetItem *item = m->item(indices.at(i));
        item->d->selected = false;
    }

    emit q->itemSelectionChanged();
}